

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_hmac_prng.c
# Opt level: O0

int tc_hmac_prng_reseed(TCHmacPrng_t prng,uint8_t *seed,uint seedlen,uint8_t *additional_input,
                       uint additionallen)

{
  uint additionallen_local;
  uint8_t *additional_input_local;
  uint seedlen_local;
  uint8_t *seed_local;
  TCHmacPrng_t prng_local;
  
  if (((prng == (TCHmacPrng_t)0x0) || (seed == (uint8_t *)0x0)) || (seedlen < 0x20)) {
    prng_local._4_4_ = 0;
  }
  else {
    if (additional_input == (uint8_t *)0x0) {
      update(prng,seed,seedlen);
    }
    else {
      if (additionallen == 0) {
        return 0;
      }
      update(prng,seed,seedlen);
      update(prng,additional_input,additionallen);
    }
    prng->countdown = 0xffffffff;
    prng_local._4_4_ = 1;
  }
  return prng_local._4_4_;
}

Assistant:

int tc_hmac_prng_reseed(TCHmacPrng_t prng,
			const uint8_t *seed,
			unsigned int seedlen,
			const uint8_t *additional_input,
			unsigned int additionallen)
{

	/* input sanity check: */
	if (prng == (TCHmacPrng_t) 0 ||
	    seed == (const uint8_t *) 0 ||
	    seedlen < MIN_SLEN ||
	    seedlen > MAX_SLEN) {
		return TC_CRYPTO_FAIL;
	}

	if (additional_input != (const uint8_t *) 0) {
		/*
		 * Abort if additional_input is provided but has inappropriate
		 * length
		 */
		if (additionallen == 0 ||
		    additionallen > MAX_ALEN) {
			return TC_CRYPTO_FAIL;
		} else {
		/* call update for the seed and additional_input */
		update(prng, seed, seedlen);
		update(prng, additional_input, additionallen);
		}
	} else {
		/* call update only for the seed */
		update(prng, seed, seedlen);
	}

	/* ... and enable hmac_prng_generate */
	prng->countdown = MAX_GENS;

	return TC_CRYPTO_SUCCESS;
}